

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MDM.h
# Opt level: O2

int PurgeDataMDM(MDM *pMDM)

{
  int iVar1;
  char *pcVar2;
  
  iVar1 = PurgeRS232Port(&pMDM->RS232Port);
  if (iVar1 != 0) {
    pcVar2 = strtime_m();
    printf("PurgeDataMDM error (%s) : %s(pMDM=%#x)\n",pcVar2,"Error purging data from a MDM. ",
           (ulong)pMDM & 0xffffffff);
  }
  return (uint)(iVar1 != 0);
}

Assistant:

inline int PurgeDataMDM(MDM* pMDM)
{
	if (PurgeRS232Port(&pMDM->RS232Port) != EXIT_SUCCESS)
	{
		printf("PurgeDataMDM error (%s) : %s"
			"(pMDM=%#x)\n", 
			strtime_m(), 
			"Error purging data from a MDM. ", 
			(unsigned int)(intptr_t)pMDM);
		return EXIT_FAILURE;
	}

	return EXIT_SUCCESS;
}